

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIsoSlow.c
# Opt level: O0

int Iso_ObjHashAdd(Iso_Man_t *p,Iso_Obj_t *pIso)

{
  int iVar1;
  int *local_30;
  int *pPlace;
  Iso_Obj_t *pThis;
  Iso_Obj_t *pIso_local;
  Iso_Man_t *p_local;
  
  local_30 = p->pBins;
  pThis = pIso;
  pIso_local = (Iso_Obj_t *)p;
  iVar1 = Iso_ObjHash(pIso,p->nBins);
  local_30 = local_30 + iVar1;
  *(int *)(pIso_local + 1) = *(int *)(pIso_local + 1) + 1;
  pPlace = (int *)Iso_ManObj((Iso_Man_t *)pIso_local,*local_30);
  while( true ) {
    if (pPlace == (int *)0x0) {
      iVar1 = Iso_ObjId((Iso_Man_t *)pIso_local,pThis);
      *local_30 = iVar1;
      pIso_local[1].FaninSig = pIso_local[1].FaninSig + 1;
      return 0;
    }
    iVar1 = Iso_ObjCompare((Iso_Obj_t **)&pPlace,&pThis);
    if (iVar1 == 0) break;
    local_30 = pPlace + 3;
    pPlace = (int *)Iso_ManObj((Iso_Man_t *)pIso_local,*local_30);
  }
  if (pPlace[4] == 0) {
    pIso_local->Id = pIso_local->Id + 1;
    pIso_local[1].FaninSig = pIso_local[1].FaninSig - 1;
  }
  pThis->iClass = pPlace[4];
  iVar1 = Iso_ObjId((Iso_Man_t *)pIso_local,pThis);
  pPlace[4] = iVar1;
  return 1;
}

Assistant:

static inline int Iso_ObjHashAdd( Iso_Man_t * p, Iso_Obj_t * pIso )
{
    Iso_Obj_t * pThis;
    int * pPlace = p->pBins + Iso_ObjHash( pIso, p->nBins );
    p->nEntries++;
    for ( pThis = Iso_ManObj(p, *pPlace); 
          pThis; pPlace = &pThis->iNext, 
          pThis = Iso_ManObj(p, *pPlace) )
        if ( Iso_ObjCompare( &pThis, &pIso ) == 0 ) // equal signatures
        {
            if ( pThis->iClass == 0 )
            {
                p->nClasses++;
                p->nSingles--;
            }
            // add to the list
            pIso->iClass = pThis->iClass;
            pThis->iClass = Iso_ObjId( p, pIso );
            return 1;
        }
    // create new list
    *pPlace = Iso_ObjId( p, pIso );
    p->nSingles++;
    return 0;
}